

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

int __thiscall asl::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  undefined8 extraout_RAX;
  int __n;
  bool bVar2;
  String local_58;
  undefined4 local_40;
  Socket local_30;
  Socket server;
  int port_local;
  String *ip_local;
  SocketServer *this_local;
  
  server.super_SmartObject._p._4_4_ = (uint)__addr;
  Socket::Socket(&local_30);
  uVar1 = Socket::bind(&local_30,__fd,(sockaddr *)(ulong)server.super_SmartObject._p._4_4_,__len);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    Socket::listen(&local_30,0x28,__n);
    Sockets::operator<<(&this->_sockets,&local_30);
  }
  else {
    Socket::errorMsg(&local_58,&local_30);
    asl::String::operator=(&this->_socketError,&local_58);
    asl::String::~String(&local_58);
  }
  local_40 = 1;
  Socket::~Socket(&local_30);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar2);
}

Assistant:

bool SocketServer::bind(const String& ip, int port)
{
	Socket server;
	if(server.bind(ip, port))
	{
		server.listen(40);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
	return false;
}